

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::FunctionBody::SetLiteralRegex(FunctionBody *this,uint index,RegexPattern *pattern)

{
  char *addr;
  RegexPattern *pRVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  void *pvVar6;
  
  uVar4 = GetCountField(this,LiteralRegexCount);
  if (uVar4 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19b7,"(index < GetLiteralRegexCount())",
                                "index < GetLiteralRegexCount()");
    if (!bVar3) goto LAB_00779a7c;
    *puVar5 = 0;
  }
  pvVar6 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,LiteralRegexes);
  if (pvVar6 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19b8,"(this->GetLiteralRegexes())","this->GetLiteralRegexes()");
    if (!bVar3) goto LAB_00779a7c;
    *puVar5 = 0;
  }
  pvVar6 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,LiteralRegexes);
  pRVar1 = *(RegexPattern **)((long)pvVar6 + (ulong)index * 8);
  if (pRVar1 != (RegexPattern *)0x0 && pRVar1 == pattern) {
    return;
  }
  if (pRVar1 != (RegexPattern *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19bf,"(!literalRegexes[index])","!literalRegexes[index]");
    if (!bVar3) {
LAB_00779a7c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  addr = (char *)((long)pvVar6 + (ulong)index * 8);
  Memory::Recycler::WBSetBit(addr);
  *(RegexPattern **)addr = pattern;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void FunctionBody::SetLiteralRegex(const uint index, UnifiedRegex::RegexPattern *const pattern)
    {
        Assert(index < GetLiteralRegexCount());
        Assert(this->GetLiteralRegexes());

        auto literalRegexes = this->GetLiteralRegexes();
        if (literalRegexes[index] && literalRegexes[index] == pattern)
        {
            return;
        }
        Assert(!literalRegexes[index]);

        literalRegexes[index] = pattern;
    }